

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

stbtt_int32 stbtt__GetCoverageIndex(stbtt_uint8 *coverageTable,int glyph)

{
  stbtt_uint16 sVar1;
  stbtt_uint16 sVar2;
  int iVar3;
  stbtt_uint8 *p;
  stbtt_uint16 startCoverageIndex;
  stbtt_uint8 *rangeRecord;
  int needle_1;
  int strawEnd;
  int strawStart;
  stbtt_int32 m_1;
  stbtt_int32 r_1;
  stbtt_int32 l_1;
  stbtt_uint8 *rangeArray;
  stbtt_uint16 rangeCount;
  stbtt_uint16 glyphID;
  stbtt_uint8 *glyphArray;
  int needle;
  int straw;
  stbtt_int32 m;
  stbtt_int32 r;
  stbtt_int32 l;
  stbtt_uint16 glyphCount;
  stbtt_uint16 coverageFormat;
  int glyph_local;
  stbtt_uint8 *coverageTable_local;
  
  sVar1 = ttUSHORT(coverageTable);
  if (sVar1 == 1) {
    sVar1 = ttUSHORT(coverageTable + 2);
    m = 0;
    straw = sVar1 - 1;
    while (m <= straw) {
      iVar3 = m + straw >> 1;
      sVar1 = ttUSHORT(coverageTable + (long)(iVar3 << 1) + 4);
      if (glyph < (int)(uint)sVar1) {
        straw = iVar3 + -1;
      }
      else {
        if (glyph <= (int)(uint)sVar1) {
          return iVar3;
        }
        m = iVar3 + 1;
      }
    }
  }
  else {
    if (sVar1 != 2) {
      return -1;
    }
    sVar1 = ttUSHORT(coverageTable + 2);
    m_1 = 0;
    strawStart = sVar1 - 1;
    while (m_1 <= strawStart) {
      iVar3 = m_1 + strawStart >> 1;
      p = coverageTable + (long)(iVar3 * 6) + 4;
      sVar1 = ttUSHORT(p);
      sVar2 = ttUSHORT(p + 2);
      if (glyph < (int)(uint)sVar1) {
        strawStart = iVar3 + -1;
      }
      else {
        if (glyph <= (int)(uint)sVar2) {
          sVar2 = ttUSHORT(p + 4);
          return ((uint)sVar2 + glyph) - (uint)sVar1;
        }
        m_1 = iVar3 + 1;
      }
    }
  }
  return -1;
}

Assistant:

static stbtt_int32 stbtt__GetCoverageIndex(stbtt_uint8 *coverageTable, int glyph)
{
   stbtt_uint16 coverageFormat = ttUSHORT(coverageTable);
   switch (coverageFormat) {
      case 1: {
         stbtt_uint16 glyphCount = ttUSHORT(coverageTable + 2);

         // Binary search.
         stbtt_int32 l=0, r=glyphCount-1, m;
         int straw, needle=glyph;
         while (l <= r) {
            stbtt_uint8 *glyphArray = coverageTable + 4;
            stbtt_uint16 glyphID;
            m = (l + r) >> 1;
            glyphID = ttUSHORT(glyphArray + 2 * m);
            straw = glyphID;
            if (needle < straw)
               r = m - 1;
            else if (needle > straw)
               l = m + 1;
            else {
               return m;
            }
         }
         break;
      }

      case 2: {
         stbtt_uint16 rangeCount = ttUSHORT(coverageTable + 2);
         stbtt_uint8 *rangeArray = coverageTable + 4;

         // Binary search.
         stbtt_int32 l=0, r=rangeCount-1, m;
         int strawStart, strawEnd, needle=glyph;
         while (l <= r) {
            stbtt_uint8 *rangeRecord;
            m = (l + r) >> 1;
            rangeRecord = rangeArray + 6 * m;
            strawStart = ttUSHORT(rangeRecord);
            strawEnd = ttUSHORT(rangeRecord + 2);
            if (needle < strawStart)
               r = m - 1;
            else if (needle > strawEnd)
               l = m + 1;
            else {
               stbtt_uint16 startCoverageIndex = ttUSHORT(rangeRecord + 4);
               return startCoverageIndex + glyph - strawStart;
            }
         }
         break;
      }

      default: return -1; // unsupported
   }

   return -1;
}